

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_LogicalCountExpr_Test::ExprTest_LogicalCountExpr_Test(ExprTest_LogicalCountExpr_Test *this)

{
  undefined8 *in_RDI;
  ExprTest *in_stack_00000040;
  
  ExprTest::ExprTest(in_stack_00000040);
  *in_RDI = &PTR__ExprTest_LogicalCountExpr_Test_00227e68;
  return;
}

Assistant:

TEST_F(ExprTest, LogicalCountExpr) {
  mp::LogicalCountExpr e;
  EXPECT_TRUE(e == 0);
  (void)LogicalExpr(e);
  auto lhs = factory_.MakeNumericConstant(42);
  auto rhs = factory_.EndCount(factory_.BeginCount(0));
  e = factory_.MakeLogicalCount(expr::ATMOST, lhs, rhs);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::ATMOST, e.kind());
  EXPECT_EQ(lhs, e.lhs());
  EXPECT_EQ(rhs, e.rhs());
  EXPECT_ASSERT(factory_.MakeLogicalCount(expr::IMPLICATION, lhs, rhs),
                "invalid expression kind");
  EXPECT_ASSERT(factory_.MakeLogicalCount(expr::ATMOST, NumericExpr(), rhs),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeLogicalCount(expr::ATMOST, lhs, mp::CountExpr()),
                "invalid argument");
}